

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

Var __thiscall
Js::TypedArrayBase::FindMinOrMax<double,true>
          (TypedArrayBase *this,ScriptContext *scriptContext,bool findMax)

{
  uint uVar1;
  double *pdVar2;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  undefined4 *puVar9;
  ulong uVar10;
  Var pvVar11;
  long lVar12;
  uint i;
  double value;
  double value_00;
  Var local_68;
  
  pdVar2 = (double *)this->buffer;
  uVar8 = (ulong)(this->super_ArrayBufferParent).super_ArrayObject.length;
  uVar1 = this->byteOffset;
  uVar7 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar7 < (ulong)uVar1 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9e8,
                                "(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())",
                                "sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()");
    if (!bVar5) {
LAB_00d80023:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  value_00 = *pdVar2;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  lVar12 = 8;
  uVar4 = 0;
  do {
    uVar10 = uVar4;
    value = value_00;
    if (uVar8 == uVar10) break;
    uVar1 = this->byteOffset;
    uVar7 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])();
    if ((ulong)uVar7 < (ulong)uVar1 + lVar12) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                  ,0x9ec,
                                  "((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                  ,
                                  "(i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar5) goto LAB_00d80023;
      *puVar9 = 0;
    }
    value = pdVar2[uVar10];
    bVar5 = NumberUtilities::IsNan(value);
    if (bVar5) {
      local_68 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).nan.ptr;
      value = value_00;
    }
    else if (findMax) {
      if (value <= value_00) {
LAB_00d7ffd4:
        value = value_00;
      }
    }
    else if ((value_00 <= value) &&
            (((value != 0.0 || (NAN(value))) ||
             (bVar6 = NumberUtilities::IsSpecial(value_00,0x8000000000000000), !bVar6))))
    goto LAB_00d7ffd4;
    lVar12 = lVar12 + 8;
    uVar4 = uVar10 + 1;
    value_00 = value;
  } while (!bVar5);
  if (uVar8 <= uVar10) {
    pvVar11 = JavascriptNumber::ToVarNoCheck(value,scriptContext);
    return pvVar11;
  }
  return local_68;
}

Assistant:

Var TypedArrayBase::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        T* typedBuffer = (T*)this->buffer;
        uint len = this->GetLength();

        Assert(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
        T currentRes = typedBuffer[0];
        for (uint i = 0; i < len; i++)
        {
            Assert((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            T compare = typedBuffer[i];
            if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
            if (findMax ? currentRes < compare : currentRes > compare ||
                (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
            {
                currentRes = compare;
            }
        }
        return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
    }